

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

void __thiscall line_hash_16::test_method(line_hash_16 *this)

{
  const_string local_d0;
  undefined **local_c0;
  undefined1 local_b8;
  undefined1 *local_b0;
  undefined4 **local_a8;
  undefined **local_a0;
  undefined1 local_98;
  undefined1 *local_90;
  unsigned_short **local_88;
  lazy_ostream local_80;
  undefined1 *local_70;
  char *local_68;
  assertion_result local_60;
  unsigned_short *local_48;
  undefined4 *local_40;
  undefined4 local_38;
  unsigned_short local_32;
  
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1bb840,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x19c7a3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x46;
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b8980;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = "";
  local_48 = &local_32;
  local_32 = 0;
  local_40 = &local_38;
  local_38 = 0;
  local_60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_60.m_message.px = (element_type *)0x0;
  local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_d0.m_end = "";
  local_98 = 0;
  local_b8 = 0;
  local_88 = &local_48;
  local_a0 = &PTR__lazy_ostream_001b8c80;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_40;
  local_c0 = &PTR__lazy_ostream_001b8b40;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_60,&local_80,&local_d0,0x46,CHECK,CHECK_EQUAL,2,
             "ah::line_hash< std::uint16_t >( 0 )",&local_a0,"0",&local_c0);
  boost::detail::shared_count::~shared_count(&local_60.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1bb840,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x19c7a3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x47;
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b8980;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = "";
  local_32 = assert_hash::details::line_hash_impl<unsigned_short>(0,0x12);
  local_38 = 0x12;
  local_60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_32 == 0x12);
  local_60.m_message.px = (element_type *)0x0;
  local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_d0.m_end = "";
  local_48 = &local_32;
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_001b8c80;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = &local_48;
  local_40 = &local_38;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_001b8b40;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_40;
  boost::test_tools::tt_detail::report_assertion
            (&local_60,&local_80,&local_d0,0x47,CHECK,CHECK_EQUAL,2,
             "ah::line_hash< std::uint16_t >( 0x12 )",&local_a0,"0x12",&local_c0);
  boost::detail::shared_count::~shared_count(&local_60.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1bb840,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x19c7a3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x48;
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b8980;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = "";
  local_32 = assert_hash::details::line_hash_impl<unsigned_short>(0,0x12345678);
  local_38 = 0x68ac;
  local_60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_32 == 0x68ac);
  local_60.m_message.px = (element_type *)0x0;
  local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_d0.m_end = "";
  local_48 = &local_32;
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_001b8c80;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = &local_48;
  local_40 = &local_38;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_001b8b40;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_40;
  boost::test_tools::tt_detail::report_assertion
            (&local_60,&local_80,&local_d0,0x48,CHECK,CHECK_EQUAL,2,
             "ah::line_hash< std::uint16_t >( 0x12345678 )",&local_a0,"( 0x5678 + 0x1234 ) & 0xffff"
             ,&local_c0);
  boost::detail::shared_count::~shared_count(&local_60.m_message.pn);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( line_hash_16 )
{
    BOOST_CHECK_EQUAL( ah::line_hash< std::uint16_t >( 0 ), 0 );
    BOOST_CHECK_EQUAL( ah::line_hash< std::uint16_t >( 0x12 ), 0x12 );
    BOOST_CHECK_EQUAL( ah::line_hash< std::uint16_t >( 0x12345678 ), ( 0x5678 + 0x1234 ) & 0xffff );
}